

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O3

Lifetime * __thiscall
SCCLiveness::InsertLifetime(SCCLiveness *this,StackSym *stackSym,RegNum reg,Instr *currentInstr)

{
  uint uVar1;
  JitArenaAllocator *pJVar2;
  Func *this_00;
  NodeBase *pNVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  RegSlot slotIndex;
  Lifetime *pLVar7;
  Type *ppLVar8;
  undefined1 local_68 [8];
  EditingIterator iter;
  NodeBase local_38;
  Lifetime *newLlifetime;
  
  uVar5 = IR::Instr::GetNumber(currentInstr);
  pLVar7 = (Lifetime *)new<Memory::JitArenaAllocator>(0xa0,this->tempAlloc,0x3eba5c);
  pJVar2 = this->tempAlloc;
  pLVar7->sym = stackSym;
  pLVar7->regionUseCount = (uint32 *)0x0;
  pLVar7->regionUseCountAdjust = (uint32 *)0x0;
  (pLVar7->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&pLVar7->defList;
  (pLVar7->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
  count = 0;
  (pLVar7->defList).allocator = &pJVar2->super_ArenaAllocator;
  (pLVar7->useList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&pLVar7->useList;
  (pLVar7->useList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
  count = 0;
  (pLVar7->useList).allocator = &pJVar2->super_ArenaAllocator;
  pLVar7->spillStackSlot = (StackSlot *)0x0;
  pLVar7->lastUseLabel = (LabelInstr *)0x0;
  pLVar7->region = (Region *)0x0;
  pLVar7->alloc = pJVar2;
  (pLVar7->intUsageBv).word = 0;
  (pLVar7->regPreference).word = 0;
  pLVar7->start = uVar5;
  pLVar7->end = uVar5;
  pLVar7->lastAllocationStart = 0;
  pLVar7->previousDefBlockNumber = 0;
  pLVar7->useCount = 0;
  pLVar7->useCountAdjust = 0;
  pLVar7->allDefsCost = 0;
  pLVar7->reg = reg;
  pLVar7->totalOpHelperLengthByEnd = 0;
  *(ushort *)&pLVar7->field_0x9c = (ushort)*(undefined4 *)&pLVar7->field_0x9c & 0xc000 | 8;
  uVar1 = this->totalOpHelperFullVisitedLength;
  iter.super_EditingIterator.last = (NodeBase *)stackSym;
  local_38.next = (Type)pLVar7;
  uVar6 = CurrentOpHelperVisitedLength(this,currentInstr);
  pLVar7->totalOpHelperLengthByEnd = uVar6 + uVar1;
  local_68 = (undefined1  [8])&this->lifetimeList;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_68;
  do {
    bVar4 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_68);
    if (!bVar4) break;
    ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_68);
  } while (uVar5 < (*ppLVar8)->start);
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
            ((EditingIterator *)local_68,
             (ArenaAllocator *)
             (((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)((long)local_68 + 0x10))
             ->super_SListNodeBase<Memory::ArenaAllocator>).next,(Lifetime **)&local_38);
  bVar4 = Func::IsJitInDebugMode(this->func);
  pNVar3 = iter.super_EditingIterator.last;
  if ((bVar4) && (((ulong)iter.super_EditingIterator.last[3].next & 0x2000) != 0)) {
    this_00 = this->func;
    slotIndex = StackSym::GetByteCodeRegSlot((StackSym *)iter.super_EditingIterator.last);
    bVar4 = Func::IsNonTempLocalVar(this_00,slotIndex);
    if (bVar4) {
      *(ushort *)((long)(local_38.next + 0x13) + 4) =
           *(ushort *)((long)(local_38.next + 0x13) + 4) & 0xfff7;
    }
  }
  pNVar3[9].next = local_38.next;
  return (Lifetime *)local_38.next;
}

Assistant:

Lifetime *
SCCLiveness::InsertLifetime(StackSym *stackSym, RegNum reg, IR::Instr *const currentInstr)
{
    const uint start = currentInstr->GetNumber(), end = start;
    Lifetime * newLlifetime = JitAnew(tempAlloc, Lifetime, tempAlloc, stackSym, reg, start, end);
    newLlifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);

    // Find insertion point
    // This looks like a search, but we should almost exit on the first iteration, except
    // when we have loops and some lifetimes where extended.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, &this->lifetimeList, iter)
    {
        if (lifetime->start <= start)
        {
            break;
        }
    }
    NEXT_SLIST_ENTRY_EDITING;

    iter.InsertBefore(newLlifetime);

    // let's say 'var a = 10;'. if a is not used in the function, we still want to have the instr, otherwise the write-through will not happen and upon debug bailout
    // we would not be able to restore the values to see in locals window.
    if (this->func->IsJitInDebugMode() && stackSym->HasByteCodeRegSlot() && this->func->IsNonTempLocalVar(stackSym->GetByteCodeRegSlot()))
    {
        newLlifetime->isDeadStore = false;
    }

    stackSym->scratch.linearScan.lifetime = newLlifetime;
    return newLlifetime;
}